

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::LookupParameters::save<boost::archive::text_oarchive>
          (LookupParameters *this,text_oarchive *ar,uint param_2)

{
  pointer pTVar1;
  uint uVar2;
  int nv;
  
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<cnn::Dim>(ar,&this->dim);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&nv);
  uVar2 = 0;
  while( true ) {
    pTVar1 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48) <=
        (ulong)uVar2) break;
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<cnn::Tensor>(ar,pTVar1 + uVar2);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & dim;
    int nv = values.size();
    ar & nv;
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }